

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void test_ecc_weierstrass_is_identity(void)

{
  WeierstrassCurve *wc_00;
  WeierstrassPoint *wp;
  WeierstrassPoint *pWVar1;
  WeierstrassPoint *A;
  size_t i;
  WeierstrassPoint *a;
  WeierstrassCurve *wc;
  
  wc_00 = wcurve();
  wp = ecc_weierstrass_point_new_identity(wc_00);
  A = (WeierstrassPoint *)0x1;
  while( true ) {
    pWVar1 = (WeierstrassPoint *)(*looplimit)(5);
    if (pWVar1 <= A) break;
    pWVar1 = wpoint(wc_00,(size_t)A);
    ecc_weierstrass_point_copy_into(wp,pWVar1);
    ecc_weierstrass_point_free(pWVar1);
    log_start();
    ecc_weierstrass_is_identity(wp);
    log_end();
    A = (WeierstrassPoint *)((long)&A->X + 1);
  }
  ecc_weierstrass_point_free(wp);
  ecc_weierstrass_curve_free(wc_00);
  return;
}

Assistant:

static void test_ecc_weierstrass_is_identity(void)
{
    WeierstrassCurve *wc = wcurve();
    WeierstrassPoint *a = ecc_weierstrass_point_new_identity(wc);
    for (size_t i = 1; i < looplimit(5); i++) {
        WeierstrassPoint *A = wpoint(wc, i);
        ecc_weierstrass_point_copy_into(a, A);
        ecc_weierstrass_point_free(A);

        log_start();
        ecc_weierstrass_is_identity(a);
        log_end();
    }
    ecc_weierstrass_point_free(a);
    ecc_weierstrass_curve_free(wc);
}